

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.hpp
# Opt level: O0

size_t __thiscall
zmq::encoder_base_t<zmq::v2_encoder_t>::encode
          (encoder_base_t<zmq::v2_encoder_t> *this,uchar **data_,size_t size_)

{
  size_t sVar1;
  msg_t *pmVar2;
  int *piVar3;
  unsigned_long *puVar4;
  long *plVar5;
  size_t in_RDX;
  EVP_PKEY_CTX *in_RSI;
  encoder_base_t<zmq::v2_encoder_t> *in_RDI;
  size_t to_copy;
  char *errstr_1;
  char *errstr;
  int rc;
  size_t pos;
  size_t buffersize;
  uchar *buffer;
  code *local_90;
  size_t local_78;
  uchar *local_70;
  unsigned_long local_60;
  size_t local_58;
  char *local_50;
  char *local_48;
  int local_3c;
  ulong local_38;
  size_t local_30;
  uchar *local_28;
  EVP_PKEY_CTX *local_18;
  size_t local_8;
  
  if (*(long *)in_RSI == 0) {
    local_70 = in_RDI->_buf;
  }
  else {
    local_70 = *(uchar **)in_RSI;
  }
  local_28 = local_70;
  local_78 = in_RDX;
  if (*(long *)in_RSI == 0) {
    local_78 = in_RDI->_buf_size;
  }
  local_30 = local_78;
  local_18 = in_RSI;
  pmVar2 = in_progress(in_RDI);
  if (pmVar2 == (msg_t *)0x0) {
    local_8 = 0;
  }
  else {
    local_38 = 0;
    while (local_38 < local_30) {
      if (in_RDI->_to_write == 0) {
        if ((in_RDI->_new_msg_flag & 1U) != 0) {
          local_3c = msg_t::close(in_RDI->_in_progress,(int)in_RSI);
          if (local_3c != 0) {
            piVar3 = __errno_location();
            local_48 = strerror(*piVar3);
            in_RSI = (EVP_PKEY_CTX *)0x32b5b5;
            fprintf(_stderr,"%s (%s:%d)\n",local_48,
                    "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/encoder.hpp"
                    ,0x5a);
            fflush(_stderr);
            zmq_abort((char *)0x31d712);
          }
          local_3c = msg_t::init(in_RDI->_in_progress,in_RSI);
          if (local_3c != 0) {
            piVar3 = __errno_location();
            local_50 = strerror(*piVar3);
            fprintf(_stderr,"%s (%s:%d)\n",local_50,
                    "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/encoder.hpp"
                    ,0x5c);
            fflush(_stderr);
            zmq_abort((char *)0x31d78a);
          }
          in_RDI->_in_progress = (msg_t *)0x0;
          break;
        }
        local_90 = (code *)in_RDI->_next;
        plVar5 = (long *)((long)&(in_RDI->super_i_encoder)._vptr_i_encoder +
                         *(long *)&in_RDI->field_0x20);
        if (((ulong)local_90 & 1) != 0) {
          local_90 = *(code **)(local_90 + *plVar5 + -1);
        }
        (*local_90)(plVar5);
      }
      if (((local_38 == 0) && (*(long *)local_18 == 0)) && (local_30 <= in_RDI->_to_write)) {
        *(uchar **)local_18 = in_RDI->_write_pos;
        sVar1 = in_RDI->_to_write;
        in_RDI->_write_pos = (uchar *)0x0;
        in_RDI->_to_write = 0;
        return sVar1;
      }
      local_60 = local_30 - local_38;
      puVar4 = std::min<unsigned_long>(&in_RDI->_to_write,&local_60);
      local_58 = *puVar4;
      in_RSI = (EVP_PKEY_CTX *)in_RDI->_write_pos;
      memcpy(local_28 + local_38,in_RSI,local_58);
      local_38 = local_58 + local_38;
      in_RDI->_write_pos = in_RDI->_write_pos + local_58;
      in_RDI->_to_write = in_RDI->_to_write - local_58;
    }
    *(uchar **)local_18 = local_28;
    local_8 = local_38;
  }
  return local_8;
}

Assistant:

size_t encode (unsigned char **data_, size_t size_) ZMQ_FINAL
    {
        unsigned char *buffer = !*data_ ? _buf : *data_;
        const size_t buffersize = !*data_ ? _buf_size : size_;

        if (in_progress () == NULL)
            return 0;

        size_t pos = 0;
        while (pos < buffersize) {
            //  If there are no more data to return, run the state machine.
            //  If there are still no data, return what we already have
            //  in the buffer.
            if (!_to_write) {
                if (_new_msg_flag) {
                    int rc = _in_progress->close ();
                    errno_assert (rc == 0);
                    rc = _in_progress->init ();
                    errno_assert (rc == 0);
                    _in_progress = NULL;
                    break;
                }
                (static_cast<T *> (this)->*_next) ();
            }

            //  If there are no data in the buffer yet and we are able to
            //  fill whole buffer in a single go, let's use zero-copy.
            //  There's no disadvantage to it as we cannot stuck multiple
            //  messages into the buffer anyway. Note that subsequent
            //  write(s) are non-blocking, thus each single write writes
            //  at most SO_SNDBUF bytes at once not depending on how large
            //  is the chunk returned from here.
            //  As a consequence, large messages being sent won't block
            //  other engines running in the same I/O thread for excessive
            //  amounts of time.
            if (!pos && !*data_ && _to_write >= buffersize) {
                *data_ = _write_pos;
                pos = _to_write;
                _write_pos = NULL;
                _to_write = 0;
                return pos;
            }

            //  Copy data to the buffer. If the buffer is full, return.
            const size_t to_copy = std::min (_to_write, buffersize - pos);
            memcpy (buffer + pos, _write_pos, to_copy);
            pos += to_copy;
            _write_pos += to_copy;
            _to_write -= to_copy;
        }

        *data_ = buffer;
        return pos;
    }